

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
::Table(Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        *this,Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
              *o)

{
  this->mKeyVals = (Node *)&this->mMask;
  this->mInfo = (uint8_t *)&this->mMask;
  this->mMaxNumElementsAllowed = 0;
  this->mNumElements = 0;
  this->mMask = 0;
  this->mInfoInc = 0x20;
  this->mInfoHashShift = 0;
  if (o->mMask != 0) {
    this->mKeyVals = o->mKeyVals;
    this->mInfo = o->mInfo;
    this->mNumElements = o->mNumElements;
    this->mMask = o->mMask;
    this->mMaxNumElementsAllowed = o->mMaxNumElementsAllowed;
    this->mInfoInc = o->mInfoInc;
    this->mInfoHashShift = o->mInfoHashShift;
    o->mKeyVals = (Node *)&o->mMask;
    o->mInfo = (uint8_t *)&o->mMask;
    o->mNumElements = 0;
    o->mMask = 0;
    o->mMaxNumElementsAllowed = 0;
    o->mInfoInc = 0x20;
    o->mInfoHashShift = 0;
  }
  return;
}

Assistant:

Table(Table&& o) noexcept
        : WHash(std::move(static_cast<WHash&>(o)))
        , WKeyEqual(std::move(static_cast<WKeyEqual&>(o)))
        , DataPool(std::move(static_cast<DataPool&>(o))) {
        ROBIN_HOOD_TRACE(this)
        if (o.mMask) {
            mKeyVals = std::move(o.mKeyVals);
            mInfo = std::move(o.mInfo);
            mNumElements = std::move(o.mNumElements);
            mMask = std::move(o.mMask);
            mMaxNumElementsAllowed = std::move(o.mMaxNumElementsAllowed);
            mInfoInc = std::move(o.mInfoInc);
            mInfoHashShift = std::move(o.mInfoHashShift);
            // set other's mask to 0 so its destructor won't do anything
            o.init();
        }
    }